

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

bool __thiscall Table::equals(Table *this,Table b)

{
  char cVar1;
  char cVar2;
  int j;
  long lVar3;
  int i;
  ulong uVar4;
  Table *pTVar5;
  
  pTVar5 = &b;
  for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
    lVar3 = 0;
    while (lVar3 != 3) {
      cVar1 = Cell::getNumber(this->table[0] + lVar3);
      cVar2 = Cell::getNumber(pTVar5->table[0] + lVar3);
      lVar3 = lVar3 + 1;
      if (cVar1 != cVar2) goto LAB_0010356f;
    }
    this = (Table *)(this->table + 1);
    pTVar5 = (Table *)(pTVar5->table + 1);
  }
LAB_0010356f:
  return 2 < uVar4;
}

Assistant:

bool Table::equals(Table b) {
    for (int i = 0; i < HEIGHT; i++){
        for (int j = 0; j < WIDTH; j++) {
            if (this->table[i][j].getNumber() != b.table[i][j].getNumber()) {
                return false;
            }
        }
    }
    return true;
}